

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall AggressiveBotStrategy::numCards(AggressiveBotStrategy *this)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  int iVar2;
  pointer pCVar3;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pCards->handPointer;
  iVar2 = 0;
  for (pCVar3 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar3 != (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_finish; pCVar3 = pCVar3 + 1) {
    iVar2 = iVar2 + (uint)(*pCVar3 == *(this->super_PlayerStrategy).exchangingCardType);
  }
  return iVar2;
}

Assistant:

int AggressiveBotStrategy::numCards() {
    int count = 0;
    for (auto cardType : *player->getCards()->getHand()) {
        if ((int) cardType == *exchangingCardType) {
            count++;
        }
    }
    return count;
}